

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall libtorrent::dht::rpc_manager::add_our_id(rpc_manager *this,entry *e)

{
  entry *peVar1;
  string_view local_48;
  string local_38;
  entry *local_18;
  entry *e_local;
  rpc_manager *this_local;
  
  local_18 = e;
  e_local = (entry *)this;
  digest32<160l>::to_string_abi_cxx11_(&local_38,&this->m_our_id);
  peVar1 = local_18;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"id");
  peVar1 = entry::operator[](peVar1,local_48);
  entry::operator=(peVar1,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void rpc_manager::add_our_id(entry& e)
{
	e["id"] = m_our_id.to_string();
}